

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O3

void Kit_DsdExpandCollectXor_rec(Kit_DsdNtk_t *p,uint iLit,uint *piLitsNew,int *nLitsNew)

{
  ushort uVar1;
  int iVar2;
  Kit_DsdObj_t *pKVar3;
  uint uVar4;
  ulong uVar5;
  
  if ((int)iLit < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                  ,0x12f,"int Abc_Lit2Var(int)");
  }
  uVar4 = iLit >> 1;
  uVar1 = p->nVars;
  if (uVar4 < (uint)p->nNodes + (uint)uVar1) {
    if (uVar1 <= uVar4) {
      pKVar3 = p->pNodes[(ulong)uVar4 - (ulong)uVar1];
      if (((uint)*pKVar3 & 0x1c0) == 0x100) {
        if (0x3ffffff < (uint)*pKVar3) {
          uVar5 = 0;
          do {
            Kit_DsdExpandCollectXor_rec
                      (p,(uint)*(ushort *)((long)&pKVar3[1].field_0x0 + uVar5 * 2),piLitsNew,
                       nLitsNew);
            uVar5 = uVar5 + 1;
          } while (uVar5 < (uint)*pKVar3 >> 0x1a);
        }
        if ((iLit & 1) == 0) {
          return;
        }
        if (-1 < (int)*piLitsNew) {
          *piLitsNew = *piLitsNew ^ 1;
          return;
        }
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x131,"int Abc_LitNot(int)");
      }
    }
    iVar2 = *nLitsNew;
    *nLitsNew = iVar2 + 1;
    piLitsNew[iVar2] = iLit;
    return;
  }
  __assert_fail("Id >= 0 && Id < pNtk->nVars + pNtk->nNodes",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kit.h"
                ,0x99,"Kit_DsdObj_t *Kit_DsdNtkObj(Kit_DsdNtk_t *, int)");
}

Assistant:

void Kit_DsdExpandCollectXor_rec( Kit_DsdNtk_t * p, unsigned iLit, unsigned * piLitsNew, int * nLitsNew )
{
    Kit_DsdObj_t * pObj;
    unsigned i, iLitFanin;
    // check the end of the supergate
    pObj = Kit_DsdNtkObj( p, Abc_Lit2Var(iLit) );
    if ( Abc_Lit2Var(iLit) < p->nVars || pObj->Type != KIT_DSD_XOR )
    {
        piLitsNew[(*nLitsNew)++] = iLit;
        return;
    }
    // iterate through the fanins
    pObj = Kit_DsdNtkObj( p, Abc_Lit2Var(iLit) );
    Kit_DsdObjForEachFanin( p, pObj, iLitFanin, i )
        Kit_DsdExpandCollectXor_rec( p, iLitFanin, piLitsNew, nLitsNew );
    // if the literal was complemented, pass the complemented attribute somewhere
    if ( Abc_LitIsCompl(iLit) )
        piLitsNew[0] = Abc_LitNot( piLitsNew[0] );
}